

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compress_usingDict
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,int compressionLevel)

{
  ZSTD_CCtx_params cctxParams_00;
  ZSTD_parameters params_00;
  ZSTD_CCtx_params params_01;
  size_t sVar1;
  long in_RDI;
  void *in_R8;
  long in_R9;
  void *in_stack_00000008;
  undefined4 in_stack_00000010;
  ZSTD_CCtx_params cctxParams;
  ZSTD_parameters params;
  undefined8 uVar2;
  ZSTD_CCtx_params *CCtxParams;
  size_t in_stack_fffffffffffffe90;
  unsigned_long_long in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffea4;
  size_t in_stack_ffffffffffffff08;
  void *dst_00;
  undefined4 in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if (in_R8 == (void *)0x0) {
    in_R8 = (void *)0x1;
  }
  if (in_R9 == 0) {
    in_stack_00000008 = (void *)0x0;
  }
  dst_00 = in_R8;
  ZSTD_getParams(in_stack_fffffffffffffea4,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  uVar2 = *(undefined8 *)(in_RDI + 0x18);
  CCtxParams = *(ZSTD_CCtx_params **)(in_RDI + 0x20);
  cctxParams_00.fParams.checksumFlag = (int)((ulong)*(undefined8 *)(in_RDI + 0x48) >> 0x20);
  cctxParams_00._0_36_ = *(undefined1 (*) [36])(in_RDI + 0x28);
  cctxParams_00._40_8_ = *(undefined8 *)(in_RDI + 0x50);
  cctxParams_00._48_8_ = *(undefined8 *)(in_RDI + 0x58);
  cctxParams_00._56_8_ = *(undefined8 *)(in_RDI + 0x60);
  cctxParams_00._64_8_ = *(undefined8 *)(in_RDI + 0x68);
  cctxParams_00.ldmParams._4_8_ = *(undefined8 *)(in_RDI + 0x70);
  cctxParams_00.ldmParams._12_8_ = *(undefined8 *)(in_RDI + 0x78);
  cctxParams_00._88_8_ = *(undefined8 *)(in_RDI + 0x80);
  cctxParams_00.customMem.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffa8;
  cctxParams_00.customMem.customFree = (ZSTD_freeFunction)in_stack_ffffffffffffffb0;
  cctxParams_00.customMem.opaque = in_stack_ffffffffffffffb8;
  params_00.cParams._8_8_ = local_38;
  params_00.cParams._0_8_ = uStack_40;
  params_00.cParams.searchLength = (int)in_stack_ffffffffffffff08;
  params_00.cParams.targetLength = (int)(in_stack_ffffffffffffff08 >> 0x20);
  params_00._24_8_ = in_stack_00000008;
  params_00.fParams._4_8_ = in_R8;
  ZSTD_assignParamsToCCtxParams(cctxParams_00,params_00);
  ZSTD_CCtxParam_setParameter(CCtxParams,(ZSTD_cParameter)((ulong)uVar2 >> 0x20),(uint)uVar2);
  params_01.cParams.chainLog = (int)in_stack_ffffffffffffff50;
  params_01.cParams.hashLog = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  params_01.format = (int)in_stack_ffffffffffffff48;
  params_01.cParams.windowLog = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  params_01.cParams.searchLog = (int)in_stack_ffffffffffffff58;
  params_01.cParams.searchLength = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  params_01.cParams.targetLength = (int)in_stack_ffffffffffffff60;
  params_01.cParams.strategy = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  params_01.fParams.contentSizeFlag = (int)in_stack_ffffffffffffff68;
  params_01.fParams.checksumFlag = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  params_01.fParams.noDictIDFlag = (int)in_stack_ffffffffffffff70;
  params_01.compressionLevel = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  params_01.disableLiteralCompression = (int)in_stack_ffffffffffffff78;
  params_01.forceWindow = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  params_01.nbWorkers = (int)in_stack_ffffffffffffff80;
  params_01.jobSize = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  params_01.overlapSizeLog = (int)in_stack_ffffffffffffff88;
  params_01.ldmParams.enableLdm = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  params_01.ldmParams.hashLog = (int)in_stack_ffffffffffffff90;
  params_01.ldmParams.bucketSizeLog = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  params_01.ldmParams.minMatchLength = (int)in_stack_ffffffffffffff98;
  params_01.ldmParams.hashEveryLog = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  params_01._88_8_ = in_stack_ffffffffffffffa0;
  params_01.customMem.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffa8;
  params_01.customMem.customFree = (ZSTD_freeFunction)in_stack_ffffffffffffffb0;
  params_01.customMem.opaque = in_stack_ffffffffffffffb8;
  sVar1 = ZSTD_compress_advanced_internal
                    ((ZSTD_CCtx *)CONCAT44(in_stack_00000010,in_stack_ffffffffffffff28),dst_00,
                     (size_t)in_R8,in_stack_00000008,in_stack_ffffffffffffff08,local_38,
                     in_stack_ffffffffffffff40,params_01);
  return sVar1;
}

Assistant:

size_t ZSTD_compress_usingDict(ZSTD_CCtx* cctx, void* dst, size_t dstCapacity, const void* src, size_t srcSize,
                               const void* dict, size_t dictSize, int compressionLevel)
{
    ZSTD_parameters const params = ZSTD_getParams(compressionLevel, srcSize ? srcSize : 1, dict ? dictSize : 0);
    ZSTD_CCtx_params cctxParams = ZSTD_assignParamsToCCtxParams(cctx->requestedParams, params);
    assert(params.fParams.contentSizeFlag == 1);
    ZSTD_CCtxParam_setParameter(&cctxParams, ZSTD_p_compressLiterals, compressionLevel>=0);
    return ZSTD_compress_advanced_internal(cctx, dst, dstCapacity, src, srcSize, dict, dictSize, cctxParams);
}